

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlExpandEntityInAttValue
               (xmlParserCtxtPtr ctxt,xmlSBuf *buf,xmlChar *str,xmlEntityPtr pent,int normalize,
               int *inSpace,int depth,int check)

{
  byte bVar1;
  int iVar2;
  xmlChar *name_00;
  xmlEntityPtr pent_00;
  xmlEntityPtr ent;
  xmlChar *name;
  int val;
  int chunkSize;
  int c;
  int maxDepth;
  int *inSpace_local;
  int normalize_local;
  xmlEntityPtr pent_local;
  xmlChar *str_local;
  xmlSBuf *buf_local;
  xmlParserCtxtPtr ctxt_local;
  
  iVar2 = 0x14;
  if ((ctxt->options & 0x80000U) != 0) {
    iVar2 = 0x28;
  }
  if (str != (xmlChar *)0x0) {
    pent_local = (xmlEntityPtr)str;
    str_local = (xmlChar *)buf;
    buf_local = (xmlSBuf *)ctxt;
    if (iVar2 < depth + 1) {
      xmlFatalErrMsg(ctxt,XML_ERR_RESOURCE_LIMIT,"Maximum entity nesting depth exceeded");
    }
    else {
      if (pent != (xmlEntityPtr)0x0) {
        if ((pent->flags & 8U) != 0) {
          xmlFatalErr(ctxt,XML_ERR_ENTITY_LOOP,(char *)0x0);
          xmlHaltParser((xmlParserCtxtPtr)buf_local);
          return;
        }
        if ((check != 0) && (iVar2 = xmlParserEntityCheck(ctxt,(long)pent->length), iVar2 != 0)) {
          return;
        }
      }
      name._4_4_ = 0;
      while ((int)buf_local[0xd].code < 2) {
        bVar1 = *(byte *)&pent_local->_private;
        if (bVar1 == 0x26) {
          if (*(char *)((long)&pent_local->_private + 1) == '#') {
            if (0 < (int)name._4_4_) {
              xmlSBufAddString((xmlSBuf *)str_local,
                               (xmlChar *)((long)pent_local - (long)(int)name._4_4_),name._4_4_);
              name._4_4_ = 0;
            }
            iVar2 = xmlParseStringCharRef((xmlParserCtxtPtr)buf_local,(xmlChar **)&pent_local);
            if (iVar2 == 0) {
              if (pent != (xmlEntityPtr)0x0) {
                *pent->content = '\0';
              }
              break;
            }
            if (iVar2 == 0x20) {
              if ((normalize == 0) || (*inSpace == 0)) {
                xmlSBufAddCString((xmlSBuf *)str_local," ",1);
              }
              *inSpace = 1;
            }
            else {
              xmlSBufAddChar((xmlSBuf *)str_local,iVar2);
              *inSpace = 0;
            }
          }
          else {
            if (0 < (int)name._4_4_) {
              xmlSBufAddString((xmlSBuf *)str_local,
                               (xmlChar *)((long)pent_local - (long)(int)name._4_4_),name._4_4_);
              name._4_4_ = 0;
            }
            name_00 = xmlParseStringEntityRef((xmlParserCtxtPtr)buf_local,(xmlChar **)&pent_local);
            if (name_00 == (xmlChar *)0x0) {
              if (pent != (xmlEntityPtr)0x0) {
                *pent->content = '\0';
              }
              break;
            }
            pent_00 = xmlLookupGeneralEntity((xmlParserCtxtPtr)buf_local,name_00,1);
            (*xmlFree)(name_00);
            if ((pent_00 == (xmlEntityPtr)0x0) || (pent_00->etype != XML_INTERNAL_PREDEFINED_ENTITY)
               ) {
              if ((pent_00 != (xmlEntityPtr)0x0) && (pent_00->content != (xmlChar *)0x0)) {
                if (pent != (xmlEntityPtr)0x0) {
                  pent->flags = pent->flags | 8;
                }
                xmlExpandEntityInAttValue
                          ((xmlParserCtxtPtr)buf_local,(xmlSBuf *)str_local,pent_00->content,pent_00
                           ,normalize,inSpace,depth + 1,check);
                if (pent != (xmlEntityPtr)0x0) {
                  pent->flags = pent->flags & 0xfffffff7;
                }
              }
            }
            else {
              if (pent_00->content == (xmlChar *)0x0) {
                xmlFatalErrMsg((xmlParserCtxtPtr)buf_local,XML_ERR_INTERNAL_ERROR,
                               "predefined entity has no content\n");
                break;
              }
              xmlSBufAddString((xmlSBuf *)str_local,pent_00->content,pent_00->length);
              *inSpace = 0;
            }
          }
        }
        else {
          if (bVar1 == 0) break;
          if ((pent != (xmlEntityPtr)0x0) && (bVar1 == 0x3c)) {
            xmlFatalErrMsgStr((xmlParserCtxtPtr)buf_local,XML_ERR_LT_IN_ATTRIBUTE,
                              "\'<\' in entity \'%s\' is not allowed in attributes values\n",
                              pent->name);
            break;
          }
          if (bVar1 < 0x21) {
            if ((normalize == 0) || (*inSpace == 0)) {
              if (bVar1 < 0x20) {
                if (0 < (int)name._4_4_) {
                  xmlSBufAddString((xmlSBuf *)str_local,
                                   (xmlChar *)((long)pent_local - (long)(int)name._4_4_),name._4_4_)
                  ;
                  name._4_4_ = 0;
                }
                xmlSBufAddCString((xmlSBuf *)str_local," ",1);
              }
              else {
                name._4_4_ = name._4_4_ + 1;
              }
            }
            else if (0 < (int)name._4_4_) {
              xmlSBufAddString((xmlSBuf *)str_local,
                               (xmlChar *)((long)pent_local - (long)(int)name._4_4_),name._4_4_);
              name._4_4_ = 0;
            }
            *inSpace = 1;
          }
          else {
            name._4_4_ = name._4_4_ + 1;
            *inSpace = 0;
          }
          pent_local = (xmlEntityPtr)((long)&pent_local->_private + 1);
        }
      }
      if (0 < (int)name._4_4_) {
        xmlSBufAddString((xmlSBuf *)str_local,(xmlChar *)((long)pent_local - (long)(int)name._4_4_),
                         name._4_4_);
      }
    }
  }
  return;
}

Assistant:

static void
xmlExpandEntityInAttValue(xmlParserCtxtPtr ctxt, xmlSBuf *buf,
                          const xmlChar *str, xmlEntityPtr pent, int normalize,
                          int *inSpace, int depth, int check) {
    int maxDepth = (ctxt->options & XML_PARSE_HUGE) ? 40 : 20;
    int c, chunkSize;

    if (str == NULL)
        return;

    depth += 1;
    if (depth > maxDepth) {
	xmlFatalErrMsg(ctxt, XML_ERR_RESOURCE_LIMIT,
                       "Maximum entity nesting depth exceeded");
	return;
    }

    if (pent != NULL) {
        if (pent->flags & XML_ENT_EXPANDING) {
            xmlFatalErr(ctxt, XML_ERR_ENTITY_LOOP, NULL);
            xmlHaltParser(ctxt);
            return;
        }

        if (check) {
            if (xmlParserEntityCheck(ctxt, pent->length))
                return;
        }
    }

    chunkSize = 0;

    /*
     * Note that entity values are already validated. No special
     * handling for multi-byte characters is needed.
     */
    while (!PARSER_STOPPED(ctxt)) {
        c = *str;

	if (c != '&') {
            if (c == 0)
                break;

            /*
             * If this function is called without an entity, it is used to
             * expand entities in an attribute content where less-than was
             * already unscaped and is allowed.
             */
            if ((pent != NULL) && (c == '<')) {
                xmlFatalErrMsgStr(ctxt, XML_ERR_LT_IN_ATTRIBUTE,
                        "'<' in entity '%s' is not allowed in attributes "
                        "values\n", pent->name);
                break;
            }

            if (c <= 0x20) {
                if ((normalize) && (*inSpace)) {
                    /* Skip char */
                    if (chunkSize > 0) {
                        xmlSBufAddString(buf, str - chunkSize, chunkSize);
                        chunkSize = 0;
                    }
                } else if (c < 0x20) {
                    if (chunkSize > 0) {
                        xmlSBufAddString(buf, str - chunkSize, chunkSize);
                        chunkSize = 0;
                    }

                    xmlSBufAddCString(buf, " ", 1);
                } else {
                    chunkSize += 1;
                }

                *inSpace = 1;
            } else {
                chunkSize += 1;
                *inSpace = 0;
            }

            str += 1;
        } else if (str[1] == '#') {
            int val;

            if (chunkSize > 0) {
                xmlSBufAddString(buf, str - chunkSize, chunkSize);
                chunkSize = 0;
            }

	    val = xmlParseStringCharRef(ctxt, &str);
	    if (val == 0) {
                if (pent != NULL)
                    pent->content[0] = 0;
                break;
            }

            if (val == ' ') {
                if ((!normalize) || (!*inSpace))
                    xmlSBufAddCString(buf, " ", 1);
                *inSpace = 1;
            } else {
                xmlSBufAddChar(buf, val);
                *inSpace = 0;
            }
	} else {
            xmlChar *name;
            xmlEntityPtr ent;

            if (chunkSize > 0) {
                xmlSBufAddString(buf, str - chunkSize, chunkSize);
                chunkSize = 0;
            }

	    name = xmlParseStringEntityRef(ctxt, &str);
            if (name == NULL) {
                if (pent != NULL)
                    pent->content[0] = 0;
                break;
            }

            ent = xmlLookupGeneralEntity(ctxt, name, /* inAttr */ 1);
            xmlFree(name);

	    if ((ent != NULL) &&
		(ent->etype == XML_INTERNAL_PREDEFINED_ENTITY)) {
		if (ent->content == NULL) {
		    xmlFatalErrMsg(ctxt, XML_ERR_INTERNAL_ERROR,
			    "predefined entity has no content\n");
                    break;
                }

                xmlSBufAddString(buf, ent->content, ent->length);

                *inSpace = 0;
	    } else if ((ent != NULL) && (ent->content != NULL)) {
                if (pent != NULL)
                    pent->flags |= XML_ENT_EXPANDING;
		xmlExpandEntityInAttValue(ctxt, buf, ent->content, ent,
                                          normalize, inSpace, depth, check);
                if (pent != NULL)
                    pent->flags &= ~XML_ENT_EXPANDING;
	    }
        }
    }

    if (chunkSize > 0)
        xmlSBufAddString(buf, str - chunkSize, chunkSize);
}